

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shapeutil_edge_iterator.cc
# Opt level: O0

EdgeIterator * __thiscall s2shapeutil::EdgeIterator::DebugString_abi_cxx11_(EdgeIterator *this)

{
  long in_RSI;
  AlphaNum local_108;
  AlphaNum local_d8;
  AlphaNum local_a8;
  AlphaNum local_78;
  AlphaNum local_48;
  EdgeIterator *this_local;
  
  this_local = this;
  absl::AlphaNum::AlphaNum(&local_48,"(shape=");
  absl::AlphaNum::AlphaNum(&local_78,*(int *)(in_RSI + 8));
  absl::AlphaNum::AlphaNum(&local_a8,", edge=");
  absl::AlphaNum::AlphaNum(&local_d8,*(int *)(in_RSI + 0x10));
  absl::AlphaNum::AlphaNum(&local_108,")");
  absl::StrCat<>((absl *)this,&local_48,&local_78,&local_a8,&local_d8,&local_108);
  return this;
}

Assistant:

string EdgeIterator::DebugString() const {
  return absl::StrCat("(shape=", shape_id_, ", edge=", edge_id_, ")");
}